

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_xor(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  uint64_t uVar5;
  roaring_bitmap_t *r_00;
  uint64_t uVar6;
  long lVar7;
  int i_1;
  uint32_t uVar8;
  ulong uVar9;
  char *__format;
  int iVar10;
  uint32_t i;
  roaring_bitmap_t **pprVar11;
  roaring_bitmap_t **pprVar12;
  roaring_bitmap_t *r [10];
  roaring_bitmap_t *local_88 [5];
  roaring_bitmap_t *local_60;
  roaring_bitmap_t *local_58;
  roaring_bitmap_t *local_50;
  roaring_bitmap_t *local_48;
  undefined8 local_40;
  
  uVar9 = 0;
  prVar2 = roaring_bitmap_create_with_capacity(0);
  (prVar2->high_low_container).flags = (prVar2->high_low_container).flags & 0xfe | copy_on_write;
  prVar3 = roaring_bitmap_create_with_capacity(0);
  (prVar3->high_low_container).flags = (prVar3->high_low_container).flags & 0xfe | copy_on_write;
  do {
    uVar8 = (uint32_t)uVar9;
    if ((uVar9 & 1) == 0) {
      roaring_bitmap_add(prVar2,uVar8);
    }
    if ((int)(uVar9 / 3) * 3 == uVar8) {
      roaring_bitmap_add(prVar3,uVar8);
    }
    uVar9 = (ulong)(uVar8 + 1);
  } while (uVar8 + 1 != 300);
  prVar4 = roaring_bitmap_xor(prVar2,prVar3);
  (prVar4->high_low_container).flags = (prVar4->high_low_container).flags & 0xfe | copy_on_write;
  iVar10 = 0;
  uVar9 = 0;
  do {
    uVar8 = (uint32_t)uVar9;
    if (((int)(uVar9 / 6) * 6 == uVar8) || (((int)(uVar9 / 3) * 3 != uVar8 & (byte)uVar9) != 0)) {
      _Var1 = roaring_bitmap_contains(prVar4,uVar8);
      __format = "surplus %d\n";
      if (_Var1) goto LAB_001059d5;
    }
    else {
      iVar10 = iVar10 + 1;
      _Var1 = roaring_bitmap_contains(prVar4,uVar8);
      __format = "missing %d\n";
      if (!_Var1) {
LAB_001059d5:
        printf(__format,uVar9);
      }
    }
    uVar9 = (ulong)(uVar8 + 1);
    if (uVar8 + 1 == 300) {
      uVar5 = roaring_bitmap_get_cardinality(prVar4);
      _assert_int_equal(uVar5,(long)iVar10,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,0x790);
      roaring_bitmap_free(prVar4);
      roaring_bitmap_free(prVar3);
      roaring_bitmap_free(prVar2);
      local_88[0] = gen_bitmap(0.0,1e-06,1,0,0,1000000);
      local_88[1] = gen_bitmap(1.0,-1e-06,1,0,0,1000000);
      local_88[2] = gen_bitmap(1e-05,0.0,1,0,0,2000000);
      local_88[3] = gen_bitmap(1e-05,0.0,3,0,0,2000000);
      local_88[4] = gen_bitmap(0.1,0.0,1,0,0,2000000);
      local_60 = gen_bitmap(0.001,1e-07,1,0,0,1000000);
      local_58 = gen_bitmap(0.0,1e-10,1,0,0,1000000);
      local_50 = gen_bitmap(0.5,-1e-06,1,600000,800000,1000000);
      local_48 = gen_bitmap(1.0,-1e-06,1,300000,500000,1000000);
      local_40 = 0;
      if (local_88[0] != (roaring_bitmap_t *)0x0) {
        pprVar11 = local_88;
        lVar7 = 0;
        prVar2 = local_88[0];
        do {
          pprVar11 = pprVar11 + 1;
          prVar3 = local_88[lVar7];
          pprVar12 = pprVar11;
          while (prVar3 != (roaring_bitmap_t *)0x0) {
            prVar4 = synthesized_xor(prVar2,prVar3);
            r_00 = roaring_bitmap_xor(prVar2,prVar3);
            uVar5 = roaring_bitmap_get_cardinality(r_00);
            uVar6 = roaring_bitmap_xor_cardinality(prVar2,prVar3);
            _assert_true((ulong)(uVar5 == uVar6),
                         "roaring_bitmap_get_cardinality(result) == roaring_bitmap_xor_cardinality(r[i], r[j])"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                         ,0x7b3);
            _Var1 = roaring_bitmap_equals(prVar4,r_00);
            _assert_true((ulong)_Var1,"is_equal",
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                         ,0x7b7);
            roaring_bitmap_free(prVar4);
            roaring_bitmap_free(r_00);
            prVar3 = *pprVar12;
            pprVar12 = pprVar12 + 1;
          }
          prVar2 = local_88[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (prVar2 != (roaring_bitmap_t *)0x0);
      }
      if (local_88[0] != (roaring_bitmap_t *)0x0) {
        pprVar11 = local_88;
        prVar2 = local_88[0];
        do {
          pprVar11 = pprVar11 + 1;
          roaring_bitmap_free(prVar2);
          prVar2 = *pprVar11;
        } while (prVar2 != (roaring_bitmap_t *)0x0);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_xor(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_xor(r1, r2);
    roaring_bitmap_set_copy_on_write(r1_xor_r2, copy_on_write);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if (((i % 2 == 0) || (i % 3 == 0)) && (i % 6 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_xor_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_xor_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_xor_r2), ansctr);

    roaring_bitmap_free(r1_xor_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data

    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);
            roaring_bitmap_t *result = roaring_bitmap_xor(r[i], r[j]);
            assert_true(roaring_bitmap_get_cardinality(result) ==
                        roaring_bitmap_xor_cardinality(r[i], r[j]));

            bool is_equal = roaring_bitmap_equals(expected, result);

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}